

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O2

string * __thiscall
BamTools::Internal::BamWriterPrivate::GetErrorString_abi_cxx11_
          (string *__return_storage_ptr__,BamWriterPrivate *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_errorString);
  return __return_storage_ptr__;
}

Assistant:

std::string BamWriterPrivate::GetErrorString() const
{
    return m_errorString;
}